

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.cpp
# Opt level: O2

void OpenMD::registerOptimizers(void)

{
  OptimizationFactory *pOVar1;
  OptimizationCreator *pOVar2;
  allocator<char> local_39;
  string local_38;
  
  pOVar1 = OptimizationFactory::getInstance();
  pOVar2 = (OptimizationCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SD",&local_39);
  OptimizationBuilder<QuantLib::SteepestDescent>::OptimizationBuilder
            ((OptimizationBuilder<QuantLib::SteepestDescent> *)pOVar2,&local_38);
  OptimizationFactory::registerOptimization(pOVar1,pOVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pOVar1 = OptimizationFactory::getInstance();
  pOVar2 = (OptimizationCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"CG",&local_39);
  OptimizationBuilder<QuantLib::ConjugateGradient>::OptimizationBuilder
            ((OptimizationBuilder<QuantLib::ConjugateGradient> *)pOVar2,&local_38);
  OptimizationFactory::registerOptimization(pOVar1,pOVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pOVar1 = OptimizationFactory::getInstance();
  pOVar2 = (OptimizationCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"BFGS",&local_39);
  OptimizationBuilder<QuantLib::BFGS>::OptimizationBuilder
            ((OptimizationBuilder<QuantLib::BFGS> *)pOVar2,&local_38);
  OptimizationFactory::registerOptimization(pOVar1,pOVar2);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void registerOptimizers() {
    OptimizationFactory::getInstance().registerOptimization(
        new OptimizationBuilder<QuantLib::SteepestDescent>("SD"));
    OptimizationFactory::getInstance().registerOptimization(
        new OptimizationBuilder<QuantLib::ConjugateGradient>("CG"));
    OptimizationFactory::getInstance().registerOptimization(
        new OptimizationBuilder<QuantLib::BFGS>("BFGS"));
  }